

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

void __thiscall ChainstateManager::MaybeRebalanceCaches(ChainstateManager *this)

{
  long lVar1;
  Chainstate *pCVar2;
  long lVar3;
  long lVar4;
  byte bVar5;
  bool bVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  size_t coinsdb_size;
  size_t coinstip_size;
  _Head_base<0UL,_Chainstate_*,_false> this_00;
  long in_FS_OFFSET;
  double dVar10;
  string_view logging_function;
  string_view source_file;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00._M_head_impl =
       (this->m_ibd_chainstate)._M_t.
       super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
       super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
       super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
  if (this_00._M_head_impl == (Chainstate *)0x0) {
    bVar5 = 0;
  }
  else {
    bVar5 = (this_00._M_head_impl)->m_disabled ^ 1;
  }
  pCVar2 = (this->m_snapshot_chainstate)._M_t.
           super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
           super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
           super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
  if (pCVar2 == (Chainstate *)0x0) {
    bVar7 = 0;
  }
  else {
    bVar7 = pCVar2->m_disabled ^ 1;
  }
  if (bVar5 == 0 && bVar7 == 0) {
    __assert_fail("ibd_usable || snapshot_usable",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                  ,0x183b,"void ChainstateManager::MaybeRebalanceCaches()");
  }
  if (bVar7 != 0 || (bVar5 ^ 1) != 0) {
    if (bVar5 != 0 || (bVar7 ^ 1) != 0) {
      if ((bVar5 ^ 1) == 0 && (bVar7 ^ 1) == 0) {
        bVar6 = IsInitialBlockDownload(this);
        dVar10 = (double)this->m_total_coinstip_cache * 0.05;
        uVar8 = (ulong)dVar10;
        uVar8 = (long)(dVar10 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
        dVar10 = (double)this->m_total_coinsdb_cache * 0.05;
        uVar9 = (ulong)dVar10;
        uVar9 = (long)(dVar10 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f | uVar9;
        if (bVar6) {
          Chainstate::ResizeCoinsCaches
                    ((this->m_ibd_chainstate)._M_t.
                     super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
                     super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                     super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl,uVar8,uVar9);
          lVar3 = this->m_total_coinstip_cache;
          lVar4 = this->m_total_coinsdb_cache;
          this_00._M_head_impl =
               (this->m_snapshot_chainstate)._M_t.
               super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
               super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
               super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
        }
        else {
          Chainstate::ResizeCoinsCaches
                    ((this->m_snapshot_chainstate)._M_t.
                     super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
                     super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                     super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl,uVar8,uVar9);
          lVar3 = this->m_total_coinstip_cache;
          lVar4 = this->m_total_coinsdb_cache;
          this_00._M_head_impl =
               (this->m_ibd_chainstate)._M_t.
               super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
               super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
               super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
        }
        if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00367d7e;
        uVar8 = (ulong)((double)lVar3 * 0.95);
        coinstip_size =
             (long)((double)lVar3 * 0.95 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
        uVar8 = (ulong)((double)lVar4 * 0.95);
        coinsdb_size = (long)((double)lVar4 * 0.95 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f |
                       uVar8;
        goto LAB_00367c48;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      goto LAB_00367d7e;
    }
    logging_function._M_str = "MaybeRebalanceCaches";
    logging_function._M_len = 0x14;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp";
    source_file._M_len = 0x57;
    ::LogPrintf_<>(logging_function,source_file,0x1844,ALL,Info,
                   "[snapshot] allocating all cache to the snapshot chainstate\n");
    this_00._M_head_impl =
         (this->m_snapshot_chainstate)._M_t.
         super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
         super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
         super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
  }
  coinstip_size = this->m_total_coinstip_cache;
  coinsdb_size = this->m_total_coinsdb_cache;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
LAB_00367c48:
    Chainstate::ResizeCoinsCaches(this_00._M_head_impl,coinstip_size,coinsdb_size);
    return;
  }
LAB_00367d7e:
  __stack_chk_fail();
}

Assistant:

void ChainstateManager::MaybeRebalanceCaches()
{
    AssertLockHeld(::cs_main);
    bool ibd_usable = this->IsUsable(m_ibd_chainstate.get());
    bool snapshot_usable = this->IsUsable(m_snapshot_chainstate.get());
    assert(ibd_usable || snapshot_usable);

    if (ibd_usable && !snapshot_usable) {
        // Allocate everything to the IBD chainstate. This will always happen
        // when we are not using a snapshot.
        m_ibd_chainstate->ResizeCoinsCaches(m_total_coinstip_cache, m_total_coinsdb_cache);
    }
    else if (snapshot_usable && !ibd_usable) {
        // If background validation has completed and snapshot is our active chain...
        LogPrintf("[snapshot] allocating all cache to the snapshot chainstate\n");
        // Allocate everything to the snapshot chainstate.
        m_snapshot_chainstate->ResizeCoinsCaches(m_total_coinstip_cache, m_total_coinsdb_cache);
    }
    else if (ibd_usable && snapshot_usable) {
        // If both chainstates exist, determine who needs more cache based on IBD status.
        //
        // Note: shrink caches first so that we don't inadvertently overwhelm available memory.
        if (IsInitialBlockDownload()) {
            m_ibd_chainstate->ResizeCoinsCaches(
                m_total_coinstip_cache * 0.05, m_total_coinsdb_cache * 0.05);
            m_snapshot_chainstate->ResizeCoinsCaches(
                m_total_coinstip_cache * 0.95, m_total_coinsdb_cache * 0.95);
        } else {
            m_snapshot_chainstate->ResizeCoinsCaches(
                m_total_coinstip_cache * 0.05, m_total_coinsdb_cache * 0.05);
            m_ibd_chainstate->ResizeCoinsCaches(
                m_total_coinstip_cache * 0.95, m_total_coinsdb_cache * 0.95);
        }
    }
}